

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall SQCompilation::CheckerVisitor::visitCallExpr(CheckerVisitor *this,CallExpr *expr)

{
  checkExtendToAppend(this,expr);
  checkAlreadyRequired(this,expr);
  checkCallNullable(this,expr);
  checkPersistCall(this,expr);
  checkForbiddenCall(this,expr);
  checkCallFromRoot(this,expr);
  checkForbiddenParentDir(this,expr);
  checkFormatArguments(this,expr);
  checkContainerModification(this,expr);
  checkUnwantedModification(this,expr);
  checkCannotBeNull(this,expr);
  checkBooleanLambda(this,expr);
  applyCallToScope(this,expr);
  checkAssertCall(this,expr);
  (*(this->super_Visitor)._vptr_Visitor[3])(this,expr);
  checkArguments(this,expr);
  return;
}

Assistant:

void CheckerVisitor::visitCallExpr(CallExpr *expr) {
  checkExtendToAppend(expr);
  checkAlreadyRequired(expr);
  checkCallNullable(expr);
  checkPersistCall(expr);
  checkForbiddenCall(expr);
  checkCallFromRoot(expr);
  checkForbiddenParentDir(expr);
  checkFormatArguments(expr);
  checkContainerModification(expr);
  checkUnwantedModification(expr);
  checkCannotBeNull(expr);
  checkBooleanLambda(expr);

  applyCallToScope(expr);

  checkAssertCall(expr);

  Visitor::visitCallExpr(expr);

  checkArguments(expr);
}